

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

void __thiscall czh::lexer::Match::match(Match *this,TokenType *token)

{
  bool local_f1;
  source_location local_b8;
  allocator<char> local_a9;
  string local_a8;
  source_location local_88;
  allocator<char> local_79;
  string local_78;
  source_location local_58 [3];
  allocator<char> local_39;
  string local_38;
  TokenType *local_18;
  TokenType *token_local;
  Match *this_local;
  
  if (*token != NOTE) {
    local_18 = token;
    token_local = &this->state;
    switch(this->state) {
    case INIT:
      if (*token == ID) {
        this->state = ID;
      }
      else if (*token == SCEND) {
        this->state = END;
      }
      else {
        this->last_state = this->state;
        this->state = UNEXPECTED;
      }
      break;
    case ID:
      if (*token == EQUAL) {
        this->state = EQUAL;
      }
      else if (*token == COLON) {
        this->state = END;
      }
      else {
        this->last_state = this->state;
        this->state = UNEXPECTED;
      }
      break;
    case VALUE:
    case ARR_RP:
    case SC_COLON:
    case UNEXPECTED:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Something unreachable.",&local_39);
      local_58[0]._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00277110;
      czh::error::czh_unreachable(&local_38,local_58);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    case END:
      local_f1 = true;
      if (*local_18 != SEND) {
        local_f1 = *local_18 == FEND;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Unexpected end of file.",&local_79);
      local_88._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00277128;
      czh::error::czh_assert(local_f1,&local_78,&local_88);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      reset(this);
      break;
    case ARR_VALUE:
      if (*token == ARR_RP) {
        this->state = END;
      }
      else if (*token == COMMA) {
        this->state = COMMA;
      }
      else {
        this->last_state = this->state;
        this->state = UNEXPECTED;
      }
      break;
    case EQUAL:
      switch(*token) {
      case ID:
        this->state = REF_ID;
        break;
      case VALUE:
        this->state = END;
        break;
      default:
        this->last_state = this->state;
        this->state = UNEXPECTED;
        break;
      case ARR_LP:
        this->state = ARR_LP;
        break;
      case REF:
        this->state = REF;
      }
      break;
    case ARR_LP:
      if (*token == VALUE) {
        this->state = ARR_VALUE;
      }
      else if (*token == ARR_RP) {
        this->state = END;
      }
      else {
        this->last_state = this->state;
        this->state = UNEXPECTED;
      }
      break;
    case COMMA:
      if (*token == VALUE) {
        this->state = ARR_VALUE;
      }
      else {
        this->last_state = this->state;
        this->state = UNEXPECTED;
      }
      break;
    case REF:
      if (*token == ID) {
        this->state = REF_ID;
      }
      else {
        this->last_state = this->state;
        this->state = UNEXPECTED;
      }
      break;
    case REF_ID:
      if (*token == REF) {
        this->state = REF;
      }
      else if (*token - FEND < 2) {
        reset(this);
      }
      else {
        reset(this);
        match(this,local_18);
      }
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Something unreachable.",&local_a9);
      local_b8._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00277140;
      czh::error::czh_unreachable(&local_a8,&local_b8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
  }
  return;
}

Assistant:

void match(const token::TokenType &token)
    {
      if (token == token::TokenType::NOTE) return;
      switch (state)
      {
        case State::INIT:
          switch (token)
          {
            case token::TokenType::ID:
              state = State::ID;
              break;
            case token::TokenType::SCEND:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ID:
          switch (token)
          {
            case token::TokenType::EQUAL:
              state = State::EQUAL;
              break;
            case token::TokenType::COLON:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EQUAL:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::END;
              break;
            case token::TokenType::ARR_LP:
              state = State::ARR_LP;
              break;
            case token::TokenType::REF:
              state = State::REF;
              break;
            case token::TokenType::ID:
              state = State::REF_ID;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ARR_LP:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::ARR_VALUE;
              break;
            case token::TokenType::ARR_RP:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ARR_VALUE:
          switch (token)
          {
            case token::TokenType::COMMA:
              state = State::COMMA;
              break;
            case token::TokenType::ARR_RP:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::COMMA:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::ARR_VALUE;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::REF:
          switch (token)
          {
            case token::TokenType::ID:
              state = State::REF_ID;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::REF_ID:
          switch (token)
          {
            case token::TokenType::REF:
              state = State::REF;
              break;
            case token::TokenType::SEND:
            case token::TokenType::FEND:
              reset();
              break;
            default:
              reset();
              match(token);
              break;
          }
          break;
        case State::VALUE:
        case State::ARR_RP:
        case State::SC_COLON:
        case State::UNEXPECTED:
          error::czh_unreachable();
        case State::END:
          error::czh_assert(token == token::TokenType::SEND || token == token::TokenType::FEND,
                            "Unexpected end of file.");
          reset();
          break;
        default:
          error::czh_unreachable();
      }
    }